

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O2

DdNode * zdd_subset0_aux(DdManager *zdd,DdNode *P,DdNode *zvar)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *T;
  DdNode *E;
  
  pDVar4 = cuddCacheLookup2Zdd(zdd,zdd_subset0_aux,P,zvar);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  if ((ulong)P->index == 0x7fffffff) {
    cuddCacheInsert2(zdd,zdd_subset0_aux,P,zvar,P);
    return P;
  }
  iVar2 = zdd->permZ[zvar->index];
  iVar3 = zdd->permZ[P->index];
  pDVar4 = P;
  if (iVar3 <= iVar2) {
    if (iVar3 != iVar2) {
      T = zdd_subset0_aux(zdd,(P->type).kids.T,zvar);
      if (T != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        E = zdd_subset0_aux(zdd,(P->type).kids.E,zvar);
        if (E != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar4 = cuddZddGetNode(zdd,P->index,T,E);
          if (pDVar4 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            goto LAB_0066c737;
          }
          Cudd_RecursiveDerefZdd(zdd,T);
          T = E;
        }
        Cudd_RecursiveDerefZdd(zdd,T);
      }
      return (DdNode *)0x0;
    }
    pDVar4 = (P->type).kids.E;
  }
LAB_0066c737:
  cuddCacheInsert2(zdd,zdd_subset0_aux,P,zvar,pDVar4);
  return pDVar4;
}

Assistant:

static DdNode *
zdd_subset0_aux(
  DdManager * zdd,
  DdNode * P,
  DdNode * zvar)
{
    int         top_var, level;
    DdNode      *res, *t, *e;

    statLine(zdd);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(zdd, zdd_subset0_aux, P, zvar);
    if (res != NULL)
        return(res);

    if (cuddIsConstant(P)) {
        res = P;
        cuddCacheInsert2(zdd, zdd_subset0_aux, P, zvar, res);
        return(res);
    }

    top_var = zdd->permZ[P->index];
    level = zdd->permZ[zvar->index];

    if (top_var > level) {
        res = P;
    }
    else if (top_var == level) {
        res = cuddE(P);
    }
    else {
        t = zdd_subset0_aux(zdd, cuddT(P), zvar);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = zdd_subset0_aux(zdd, cuddE(P), zvar);
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            Cudd_RecursiveDerefZdd(zdd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(zdd, zdd_subset0_aux, P, zvar, res);

    return(res);

}